

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O2

void __thiscall
jrtplib::RTPSession::BYEDestroy
          (RTPSession *this,RTPTime *maxwaittime,void *reason,size_t reasonlength)

{
  list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_> *this_00;
  bool bVar1;
  int iVar2;
  size_t reasonlength_00;
  bool bVar3;
  _List_node_base *p_Var4;
  RTPTime RVar5;
  RTCPCompoundPacket *pack;
  double local_40;
  RTPTime local_38;
  
  if (this->created == true) {
    RVar5 = RTPTime::CurrentTime();
    local_40 = RVar5.m_t + maxwaittime->m_t;
    if (this->sentpackets == true) {
      reasonlength_00 = 0xff;
      if (reasonlength < 0xff) {
        reasonlength_00 = reasonlength;
      }
      iVar2 = RTCPPacketBuilder::BuildBYEPacket
                        (&this->rtcpbuilder,&pack,reason,reasonlength_00,this->useSR_BYEifpossible);
      if (-1 < iVar2) {
        std::__cxx11::
        list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::
        push_back(&this->byepackets,&pack);
        if ((this->byepackets).
            super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
            ._M_impl._M_node._M_size == 1) {
          RTCPScheduler::ScheduleBYEPacket(&this->rtcpsched,pack->compoundpacketlength);
        }
      }
    }
    this_00 = &this->byepackets;
    if ((this->byepackets).
        super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this_00) {
      bVar1 = false;
LAB_00122998:
      bVar3 = bVar1;
      if (!bVar3) {
        RVar5 = RTPTime::CurrentTime();
        if (local_40 <= RVar5.m_t) {
          bVar3 = true;
        }
        bVar1 = RTCPScheduler::IsTime(&this->rtcpsched);
        if (bVar1) goto code_r0x001229c1;
        goto LAB_00122a28;
      }
    }
    if (this->deletetransmitter == true) {
      RTPDelete<jrtplib::RTPTransmitter>(this->rtptrans,(this->super_RTPMemoryObject).mgr);
    }
    RTPPacketBuilder::Destroy(&this->packetbuilder);
    RTCPPacketBuilder::Destroy(&this->rtcpbuilder);
    RTCPScheduler::Reset(&this->rtcpsched);
    RTPCollisionList::Clear(&this->collisionlist);
    RTPSources::Clear(&(this->sources).super_RTPSources);
    p_Var4 = (_List_node_base *)this_00;
    while (p_Var4 = (((_List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                       *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var4 != (_List_node_base *)this_00) {
      RTPDelete<jrtplib::RTCPCompoundPacket>
                ((RTCPCompoundPacket *)p_Var4[1]._M_next,(this->super_RTPMemoryObject).mgr);
    }
    std::__cxx11::
    list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::clear
              (this_00);
    this->created = false;
  }
  return;
code_r0x001229c1:
  pack = (RTCPCompoundPacket *)
         (this->byepackets).
         super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
         ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
  std::__cxx11::list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
  ::pop_front(this_00);
  SendRTCPData(this,pack->compoundpacket,pack->compoundpacketlength);
  (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x14])(this,pack);
  RTPDelete<jrtplib::RTCPCompoundPacket>(pack,(this->super_RTPMemoryObject).mgr);
  p_Var4 = (this->byepackets).
           super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  bVar1 = true;
  if (p_Var4 != (_List_node_base *)this_00) {
    RTCPScheduler::ScheduleBYEPacket(&this->rtcpsched,(size_t)p_Var4[1]._M_next[2]._M_next);
LAB_00122a28:
    bVar1 = bVar3;
    if (!bVar3) {
      local_38.m_t = 0.09999999999999999;
      RTPTime::Wait(&local_38);
    }
  }
  goto LAB_00122998;
}

Assistant:

void RTPSession::BYEDestroy(const RTPTime &maxwaittime,const void *reason,size_t reasonlength)
{
	if (!created)
		return;

	// first, stop the thread so we have full control over all components
	
#ifdef RTP_SUPPORT_THREAD
	if (pollthread)
		RTPDelete(pollthread,GetMemoryManager());
#endif // RTP_SUPPORT_THREAD

	RTPTime stoptime = RTPTime::CurrentTime();
	stoptime += maxwaittime;

	// add bye packet to the list if we've sent data

	RTCPCompoundPacket *pack;

	if (sentpackets)
	{
		int status;
		
		reasonlength = (reasonlength>RTCP_BYE_MAXREASONLENGTH)?RTCP_BYE_MAXREASONLENGTH:reasonlength;
	       	status = rtcpbuilder.BuildBYEPacket(&pack,reason,reasonlength,useSR_BYEifpossible);
		if (status >= 0)
		{
			byepackets.push_back(pack);
	
			if (byepackets.size() == 1)
				rtcpsched.ScheduleBYEPacket(pack->GetCompoundPacketLength());
		}
	}
	
	if (!byepackets.empty())
	{
		bool done = false;
		
		while (!done)
		{
			RTPTime curtime = RTPTime::CurrentTime();
			
			if (curtime >= stoptime)
				done = true;
		
			if (rtcpsched.IsTime())
			{
				pack = *(byepackets.begin());
				byepackets.pop_front();
			
				SendRTCPData(pack->GetCompoundPacketData(),pack->GetCompoundPacketLength());
				
				OnSendRTCPCompoundPacket(pack); // we'll place this after the actual send to avoid tampering
				
				RTPDelete(pack,GetMemoryManager());
				if (!byepackets.empty()) // more bye packets to send, schedule them
					rtcpsched.ScheduleBYEPacket((*(byepackets.begin()))->GetCompoundPacketLength());
				else
					done = true;
			}
			if (!done)
				RTPTime::Wait(RTPTime(0,100000));
		}
	}
	
	if (deletetransmitter)
		RTPDelete(rtptrans,GetMemoryManager());
	packetbuilder.Destroy();
	rtcpbuilder.Destroy();
	rtcpsched.Reset();
	collisionlist.Clear();
	sources.Clear();

	// clear rest of bye packets
	std::list<RTCPCompoundPacket *>::const_iterator it;

	for (it = byepackets.begin() ; it != byepackets.end() ; it++)
		RTPDelete(*it,GetMemoryManager());
	byepackets.clear();
	
	created = false;
}